

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O0

void __thiscall libDAI::MaxPlus::calcNewMessage(MaxPlus *this,size_t iI)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  edge_type *peVar4;
  ostream *poVar5;
  void *this_00;
  TFactor<double> *pTVar6;
  reference puVar7;
  Var *this_01;
  Index *this_02;
  size_t sVar8;
  double *pdVar9;
  double *__b;
  ostream *P;
  size_type in_RSI;
  MaxPlus *in_RDI;
  double dVar10;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar11 [16];
  undefined1 extraout_var_00 [56];
  size_t i_3;
  double avg;
  size_t i_2;
  Index i_newm;
  VarSet *vs;
  VarSet *ns;
  size_t i_1;
  Prob *newm;
  size_t r;
  Prob *m;
  nb_cit J;
  Prob sum_j;
  _ind_t *ind;
  nb_cit j;
  Prob sum;
  size_t I;
  size_t i;
  FactorGraph *g;
  TProb<double> *in_stack_fffffffffffffd28;
  FactorGraph *in_stack_fffffffffffffd30;
  Var *in_stack_fffffffffffffd38;
  MaxPlus *in_stack_fffffffffffffd40;
  TProb<double> *in_stack_fffffffffffffd48;
  Index *in_stack_fffffffffffffd50;
  Real in_stack_fffffffffffffd60;
  double dVar13;
  size_t in_stack_fffffffffffffd68;
  TProb<double> *in_stack_fffffffffffffd70;
  ulong uVar14;
  VarSet *in_stack_fffffffffffffe00;
  Index *P_00;
  ulong local_158;
  ulong local_148;
  Index local_140;
  VarSet *local_f0;
  undefined1 local_e8 [32];
  undefined1 *local_c8;
  Index *local_c0;
  reference local_b8;
  unsigned_long *local_b0;
  ulong local_a8;
  unsigned_long *local_a0;
  Prob *local_98;
  unsigned_long *local_90;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88 [4];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  unsigned_long *local_60;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48 [4];
  ulong local_28;
  unsigned_long local_20;
  long *local_18;
  size_type local_10;
  undefined1 auVar12 [64];
  
  local_10 = in_RSI;
  iVar3 = (*(in_RDI->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  local_18 = (long *)CONCAT44(extraout_var,iVar3);
  peVar4 = FactorGraph::edge(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
  local_20 = peVar4->first;
  peVar4 = FactorGraph::edge(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
  local_28 = peVar4->second;
  if (5 < (in_RDI->Props).verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"new Mess F");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
    poVar5 = std::operator<<(poVar5," -> v");
    this_00 = (void *)std::ostream::operator<<(poVar5,local_20);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  pTVar6 = (TFactor<double> *)(**(code **)(*local_18 + 0x50))(local_18,local_28);
  TFactor<double>::p(pTVar6);
  TProb<double>::TProb((TProb<double> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  FactorGraph::nbF(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
  local_48[0]._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd28
                 );
  while( true ) {
    FactorGraph::nbF(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
    local_60 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffd28);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffd30,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffd28);
    if (!bVar2) break;
    puVar7 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(local_48);
    if (*puVar7 != local_20) {
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_48);
      local_68 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 index(in_RDI,(char *)*puVar7,(int)local_28);
      plVar1 = local_18;
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_48);
      this_01 = (Var *)(**(code **)(*plVar1 + 0x30))(plVar1,*puVar7);
      Var::states(this_01);
      TProb<double>::TProb
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_48);
      FactorGraph::nbV(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
      local_88[0]._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffd28);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_48);
        FactorGraph::nbV(in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
        local_90 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffd28);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffd30,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffd28);
        if (!bVar2) break;
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(local_88);
        if (*puVar7 != local_28) {
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_48);
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_88);
          local_98 = message(in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                             (size_t)in_stack_fffffffffffffd30);
          TProb<double>::operator+=
                    ((TProb<double> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        }
        local_a0 = (unsigned_long *)
                   __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffd38,
                                (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
      }
      local_a8 = 0;
      while( true ) {
        uVar14 = local_a8;
        sVar8 = TProb<double>::size((TProb<double> *)0xbb0577);
        if (sVar8 <= uVar14) break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_68,local_a8);
        pdVar9 = TProb<double>::operator[]
                           ((TProb<double> *)in_stack_fffffffffffffd30,
                            (size_t)in_stack_fffffffffffffd28);
        dVar10 = *pdVar9;
        pdVar9 = TProb<double>::operator[]
                           ((TProb<double> *)in_stack_fffffffffffffd30,
                            (size_t)in_stack_fffffffffffffd28);
        *pdVar9 = dVar10 + *pdVar9;
        local_a8 = local_a8 + 1;
      }
      TProb<double>::~TProb((TProb<double> *)0xbb063c);
    }
    local_b0 = (unsigned_long *)
               __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffd38,
                            (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  }
  local_b8 = std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
                       (&in_RDI->_newmessages,local_10);
  local_c0 = (Index *)0x0;
  while( true ) {
    P_00 = local_c0;
    this_02 = (Index *)TProb<double>::size((TProb<double> *)0xbb06a7);
    if (this_02 <= P_00) break;
    in_stack_fffffffffffffe00 =
         (VarSet *)
         TProb<double>::operator[]
                   ((TProb<double> *)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
    (in_stack_fffffffffffffe00->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0xfff0000000000000;
    local_c0 = (Index *)((long)&(((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)
                                 &local_c0->_index)->
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>).
                                _M_impl.super__Vector_impl_data._M_start + 1);
  }
  (**(code **)(*local_18 + 0x30))(local_18,local_20);
  VarSet::VarSet((VarSet *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_c8 = local_e8;
  pTVar6 = (TFactor<double> *)(**(code **)(*local_18 + 0x50))(local_18,local_28);
  auVar12._8_56_ = extraout_var_00;
  auVar12._0_8_ = extraout_XMM1_Qa;
  local_f0 = TFactor<double>::vars(pTVar6);
  Index::Index(this_02,(VarSet *)P_00,in_stack_fffffffffffffe00);
  local_148 = 0;
  while( true ) {
    sVar8 = TProb<double>::size((TProb<double> *)0xbb07ee);
    auVar11 = auVar12._0_16_;
    if (sVar8 <= local_148) break;
    Index::operator_cast_to_long(&local_140);
    pdVar9 = TProb<double>::operator[]
                       ((TProb<double> *)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28
                       );
    __b = TProb<double>::operator[]
                    ((TProb<double> *)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28);
    pdVar9 = std::max<double>(pdVar9,__b);
    dVar10 = *pdVar9;
    Index::operator_cast_to_long(&local_140);
    pdVar9 = TProb<double>::operator[]
                       ((TProb<double> *)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28
                       );
    *pdVar9 = dVar10;
    local_148 = local_148 + 1;
    Index::operator++(in_stack_fffffffffffffd50);
  }
  dVar10 = TProb<double>::totalSum((TProb<double> *)in_stack_fffffffffffffd40);
  sVar8 = TProb<double>::size((TProb<double> *)0xbb097b);
  auVar11 = vcvtusi2sd_avx512f(auVar11,sVar8);
  local_158 = 0;
  while( true ) {
    uVar14 = local_158;
    sVar8 = TProb<double>::size((TProb<double> *)0xbb09c6);
    if (sVar8 <= uVar14) break;
    dVar13 = dVar10 / auVar11._0_8_;
    pdVar9 = TProb<double>::operator[]
                       ((TProb<double> *)in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28
                       );
    *pdVar9 = *pdVar9 - dVar13;
    local_158 = local_158 + 1;
  }
  if (5 < (in_RDI->Props).verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\tnew Mess F");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
    poVar5 = std::operator<<(poVar5," -> v");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20);
    P = std::operator<<(poVar5," = ");
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              (&in_RDI->_newmessages,local_10);
    in_stack_fffffffffffffd30 = (FactorGraph *)libDAI::operator<<(poVar5,(TProb<double> *)P);
    std::ostream::operator<<(in_stack_fffffffffffffd30,std::endl<char,std::char_traits<char>>);
  }
  Index::~Index((Index *)in_stack_fffffffffffffd30);
  VarSet::~VarSet((VarSet *)0xbb0b28);
  TProb<double>::~TProb((TProb<double> *)0xbb0b35);
  return;
}

Assistant:

void MaxPlus::calcNewMessage (size_t iI) 
    { 
        const FactorGraph& g = grm();
        //FRANS: iI is the index of the edge in the factorgraph...
        //this function calculates the updated message I->i
        size_t i = g.edge(iI).first;    //FRANS: here we get the index of the variable (? 'first' type) corresponding to edge iI
        size_t I = g.edge(iI).second;   //FRANS: here we get the index of the factor (? the 'second' type) corresponding to edge iI
        ///FRANS: indeed 1st=var, 2nd=Factor, see "typedef BipartiteGraph<Var,Factor> BipFacGraph;" in factorgraph.h, 38
        if( Props.verbose >= 6)
            cout << "new Mess F"<< I <<" -> v"<< i<<endl;

        Prob sum( g.factor(I).p() );

        //if( Props.verbose >= 8)
        //cout<<"\tInitialized sum = " << sum << endl;

        //FRANS: nbF(I)  returns a list to neighbors of Factor I (of the 
        // graph.model) (implementation-wise this list is a vector<size_t> )
        //FRANS: FactorGraph::nb_cit is a typedef provides an iterator of 
        // the list of neighbors
        //Prob & m; //can we make this a reference?
        for( FactorGraph::nb_cit j = g.nbF(I).begin(); j != g.nbF(I).end(); j++ )   
            if( *j != i ) {     // for all j in I \ i                                       
                //if( Props.verbose >= 5)
                    //cout << "\t\tneighbor variable v"<<*j<<" of factor F"<<I<<endl;

                // ind is the precalculated Index(j,I) i.e. to x_I == k corresponds x_j == ind[k]
                _ind_t* ind = &(index(*j,I));
                // sum_j will be the sum of messages coming into j
                Prob sum_j( g.var(*j).states(), 0.0 ); 
                //if( Props.verbose >= 8)
                    //cout << "\t\tInitialized sum_j = "<< sum_j << "(j=" << *j << ")" << endl;

                for( FactorGraph::nb_cit J = g.nbV(*j).begin(); J != g.nbV(*j).end(); J++ ) 
                    if( *J != I ) {     
                        // for all J in nb(j) \ I 
                        //if( Props.verbose >= 5)
                            //cout << "\t\tneighbor factor F"<<*J<<" of variable v"<<*j<<endl;
                        // message(*j,*J) is the (previous) message received by j from J.
                        const Prob & m =  message(*j,*J);
                        //if( Props.verbose >= 5)
                            //cout << "\t\tPrev. message from  F" <<*J<< " -> v" <<*j<< " = " <<m<<endl;
                        sum_j += m;
                        //if( Props.verbose >= 7)
                            //cout << "\t\tsum_j = "<< sum_j <<endl;
                    } 

                // add sum_j to sum
                //if( Props.verbose >= 6)
                    //cout << "\tadding sum_j = "<< sum_j << " to sum = " << sum << endl;
                    
                //we need to add sum_j[k] to all entries sum[r] in sum that are consistent with sum_j[k],
                //i.e., all entries where variable j has state k.
                for( size_t r = 0; r < sum.size(); r++ )
                {
                    //size_t sum_j_index = (*ind)[r];
                    //if( Props.verbose >= 9)
                        //cout << "\t\tr="<<r<<", sum_j_index="<<sum_j_index<<endl;
                    sum[r] += sum_j[(*ind)[r]];
                }
        
            }
     
        //if( Props.verbose >= 6)
            //cout<<"\tsum = " << sum << endl;
        //old slow code....
        //Factor sum_factor ( g.factor( I ).vars(), sum);//create a factor...
        ////...which allows use to easily take the max:
        //Factor max_f = sum_factor.partMax(g.var(i)); //here we take the Max

        //make all changes directly to the new messages:
        Prob & newm = _newmessages[iI];
        //initialize to -infty
        for( size_t i = 0; i < newm.size(); i++)
            newm[i] = -INFINITY;

        //now we compute the max inline (it's an inline version of factor::partMax )
        const VarSet & ns = g.var(i);
        const VarSet & vs = g.factor( I ).vars();
        //Prob res( g.var(i).states(), -INFINITY );
        //Index i_res( ns, vs );
        //for( size_t i = 0; i < sum.size(); i++, ++i_res )
            //res[i_res] = std::max(res[i_res], sum[i]);

        Index i_newm( ns, vs );
        for( size_t i = 0; i < sum.size(); i++, ++i_newm )
            newm[i_newm] = std::max(newm[i_newm], sum[i]);

        //Prob max = max_f.p(); //here we get the desired vector (Prob) repres.
        //Prob & max = res; 
        //if( Props.verbose >= 7)
            //cout << "\t\tsum_factor = "<<sum_factor<<", max = "<<max<<endl;

        // substract average of messages to stop growing
        //size_t s = max.size();
        //double avg = max.totalSum() / s;
        //Prob newm = max - Prob(s, avg); // compute the new normalized message

        double avg = newm.totalSum() / newm.size();
        for( size_t i = 0; i < newm.size(); i++)
            newm[i] -= avg;
        

        // Store result
        //_newmessages[iI] = newm;

        if( Props.verbose >= 6)
            cout << "\tnew Mess F"<< I <<" -> v"<< i<<" = "<<_newmessages[iI]<<endl;
    }